

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

CURLcode Curl_SOCKS4(char *proxy_name,char *hostname,int remote_port,int sockindex,connectdata *conn
                    ,_Bool protocol4a)

{
  curl_socket_t cVar1;
  CURLcode CVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  SessionHandle *pSVar6;
  ulong uVar7;
  int iVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ulong uVar13;
  ssize_t written;
  SessionHandle *local_1a8;
  curl_socket_t local_19c;
  unsigned_short ip [4];
  char local_188 [4];
  undefined4 local_184;
  undefined2 local_180;
  ssize_t actualread;
  
  cVar1 = conn->sock[sockindex];
  pSVar6 = conn->data;
  lVar3 = Curl_timeleft(pSVar6,(timeval *)0x0,true);
  if (lVar3 < 0) {
    Curl_failf(pSVar6,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  local_19c = cVar1;
  curlx_nonblock(cVar1,0);
  local_1a8 = pSVar6;
  Curl_infof(pSVar6,"SOCKS4 communication to %s:%d\n",hostname,(ulong)(uint)remote_port);
  local_188[0] = '\x04';
  local_188[1] = '\x01';
  local_188[2] = (char)((uint)remote_port >> 8);
  local_188[3] = (char)remote_port;
  if (!protocol4a) {
    iVar8 = Curl_resolv(conn,hostname,remote_port,(Curl_dns_entry **)&written);
    pSVar6 = local_1a8;
    if (iVar8 == -1) {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    if ((written == 0) || (*(Curl_addrinfo **)written == (Curl_addrinfo *)0x0)) {
LAB_00120e1b:
      Curl_failf(pSVar6,"Failed to resolve \"%s\" for SOCKS4 connect.",hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
    Curl_printable_address(*(Curl_addrinfo **)written,(char *)&actualread,0x40);
    iVar8 = __isoc99_sscanf(&actualread,"%hu.%hu.%hu.%hu",ip,ip + 1,ip + 2,ip + 3);
    if (iVar8 != 4) {
      Curl_infof(pSVar6,"SOCKS4 connect to %s (locally resolved)\n",&actualread);
      Curl_resolv_unlock(pSVar6,(Curl_dns_entry *)written);
      goto LAB_00120e1b;
    }
    uVar9 = ip[0] & 0xff;
    uVar10 = ip[1] & 0xff;
    uVar11 = ip[2] & 0xff;
    uVar12 = ip[3] & 0xff;
    local_184 = CONCAT13((uVar12 != 0) * (uVar12 < 0x100) * (char)ip[3] - (0xff < uVar12),
                         CONCAT12((uVar11 != 0) * (uVar11 < 0x100) * (char)ip[2] - (0xff < uVar11),
                                  CONCAT11((uVar10 != 0) * (uVar10 < 0x100) * (char)ip[1] -
                                           (0xff < uVar10),
                                           (uVar9 != 0) * (uVar9 < 0x100) * (char)ip[0] -
                                           (0xff < uVar9))));
    Curl_infof(pSVar6,"SOCKS4 connect to %s (locally resolved)\n",&actualread);
    Curl_resolv_unlock(pSVar6,(Curl_dns_entry *)written);
  }
  local_180 = (ushort)local_180._1_1_ << 8;
  if (proxy_name != (char *)0x0) {
    sVar4 = strlen(proxy_name);
    if (0xfd < sVar4) {
      pcVar5 = "Too long SOCKS proxy name, can\'t use!\n";
      pSVar6 = local_1a8;
      goto LAB_00120dea;
    }
    memcpy(&local_180,proxy_name,sVar4 + 1);
  }
  sVar4 = strlen((char *)&local_180);
  iVar8 = (int)sVar4 + 9;
  if (protocol4a) {
    local_184 = 0x1000000;
    sVar4 = strlen(hostname);
    if (0x106 < (long)(sVar4 + (long)iVar8 + 1)) goto LAB_00120d0d;
    lVar3 = sVar4 + 1;
    strcpy(local_188 + iVar8,hostname);
  }
  else {
LAB_00120d0d:
    lVar3 = 0;
  }
  pSVar6 = local_1a8;
  CVar2 = Curl_write_plain(conn,local_19c,local_188,iVar8 + lVar3,&written);
  cVar1 = local_19c;
  if ((CVar2 == CURLE_OK) && (written == iVar8 + lVar3)) {
    if (protocol4a && lVar3 == 0) {
      sVar4 = strlen(hostname);
      CVar2 = Curl_write_plain(conn,cVar1,hostname,sVar4 + 1,&written);
      if ((CVar2 != CURLE_OK) || (written != sVar4 + 1)) goto LAB_00120dc5;
    }
    iVar8 = Curl_blockread_all(conn,cVar1,local_188,8,&actualread);
    if ((iVar8 == 0) && (actualread == 8)) {
      if (local_188[0] == '\0') {
        uVar13 = (ulong)(byte)local_188[1];
        switch(local_188[1]) {
        case 'Z':
          pcVar5 = "";
          if (protocol4a) {
            pcVar5 = "a";
          }
          Curl_infof(pSVar6,"SOCKS4%s request granted.\n",pcVar5);
          curlx_nonblock(cVar1,1);
          return CURLE_OK;
        case '[':
          uVar7 = (ulong)(ushort)(local_180 << 8 | local_180 >> 8);
          pcVar5 = 
          "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed.";
          uVar13 = 0x5b;
          break;
        case '\\':
          uVar7 = (ulong)(ushort)(local_180 << 8 | local_180 >> 8);
          pcVar5 = 
          "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
          ;
          uVar13 = 0x5c;
          break;
        case ']':
          uVar7 = (ulong)(ushort)(local_180 << 8 | local_180 >> 8);
          pcVar5 = 
          "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
          ;
          uVar13 = 0x5d;
          break;
        default:
          uVar7 = (ulong)(ushort)(local_180 << 8 | local_180 >> 8);
          pcVar5 = "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.";
        }
        Curl_failf(pSVar6,pcVar5,(ulong)(byte)local_184,(ulong)local_184._1_1_,
                   (ulong)local_184._2_1_,(ulong)local_184._3_1_,uVar7,uVar13);
        return CURLE_COULDNT_CONNECT;
      }
      pcVar5 = "SOCKS4 reply has wrong version, version should be 4.";
    }
    else {
      pcVar5 = "Failed to receive SOCKS4 connect request ack.";
    }
  }
  else {
LAB_00120dc5:
    pcVar5 = "Failed to send SOCKS4 connect request.";
  }
LAB_00120dea:
  Curl_failf(pSVar6,pcVar5);
  return CURLE_COULDNT_CONNECT;
}

Assistant:

CURLcode Curl_SOCKS4(const char *proxy_name,
                     const char *hostname,
                     int remote_port,
                     int sockindex,
                     struct connectdata *conn,
                     bool protocol4a)
{
#define SOCKS4REQLEN 262
  unsigned char socksreq[SOCKS4REQLEN]; /* room for SOCKS4 request incl. user
                                           id */
  int result;
  CURLcode code;
  curl_socket_t sock = conn->sock[sockindex];
  struct SessionHandle *data = conn->data;

  if(Curl_timeleft(data, NULL, TRUE) < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  (void)curlx_nonblock(sock, FALSE);

  infof(data, "SOCKS4 communication to %s:%d\n", hostname, remote_port);

  /*
   * Compose socks4 request
   *
   * Request format
   *
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
   *     +----+----+----+----+----+----+----+----+----+----+....+----+
   * # of bytes:  1    1      2              4           variable       1
   */

  socksreq[0] = 4; /* version (SOCKS4) */
  socksreq[1] = 1; /* connect */
  socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
  socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

  /* DNS resolve only for SOCKS4, not SOCKS4a */
  if(!protocol4a) {
    struct Curl_dns_entry *dns;
    Curl_addrinfo *hp=NULL;
    int rc;

    rc = Curl_resolv(conn, hostname, remote_port, &dns);

    if(rc == CURLRESOLV_ERROR)
      return CURLE_COULDNT_RESOLVE_PROXY;

    if(rc == CURLRESOLV_PENDING)
      /* ignores the return code, but 'dns' remains NULL on failure */
      (void)Curl_resolver_wait_resolv(conn, &dns);

    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns)
      hp=dns->addr;
    if(hp) {
      char buf[64];
      unsigned short ip[4];
      Curl_printable_address(hp, buf, sizeof(buf));

      if(4 == sscanf( buf, "%hu.%hu.%hu.%hu",
                      &ip[0], &ip[1], &ip[2], &ip[3])) {
        /* Set DSTIP */
        socksreq[4] = (unsigned char)ip[0];
        socksreq[5] = (unsigned char)ip[1];
        socksreq[6] = (unsigned char)ip[2];
        socksreq[7] = (unsigned char)ip[3];
      }
      else
        hp = NULL; /* fail! */

      infof(data, "SOCKS4 connect to %s (locally resolved)\n", buf);

      Curl_resolv_unlock(data, dns); /* not used anymore from now on */

    }
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }

  /*
   * This is currently not supporting "Identification Protocol (RFC1413)".
   */
  socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
  if(proxy_name) {
    size_t plen = strlen(proxy_name);
    if(plen >= sizeof(socksreq) - 8) {
      failf(data, "Too long SOCKS proxy name, can't use!\n");
      return CURLE_COULDNT_CONNECT;
    }
    /* copy the proxy name WITH trailing zero */
    memcpy(socksreq + 8, proxy_name, plen+1);
  }

  /*
   * Make connection
   */
  {
    ssize_t actualread;
    ssize_t written;
    ssize_t hostnamelen = 0;
    int packetsize = 9 +
      (int)strlen((char*)socksreq + 8); /* size including NUL */

    /* If SOCKS4a, set special invalid IP address 0.0.0.x */
    if(protocol4a) {
      socksreq[4] = 0;
      socksreq[5] = 0;
      socksreq[6] = 0;
      socksreq[7] = 1;
      /* If still enough room in buffer, also append hostname */
      hostnamelen = (ssize_t)strlen(hostname) + 1; /* length including NUL */
      if(packetsize + hostnamelen <= SOCKS4REQLEN)
        strcpy((char*)socksreq + packetsize, hostname);
      else
        hostnamelen = 0; /* Flag: hostname did not fit in buffer */
    }

    /* Send request */
    code = Curl_write_plain(conn, sock, (char *)socksreq,
                            packetsize + hostnamelen,
                            &written);
    if(code || (written != packetsize + hostnamelen)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLE_COULDNT_CONNECT;
    }
    if(protocol4a && hostnamelen == 0) {
      /* SOCKS4a with very long hostname - send that name separately */
      hostnamelen = (ssize_t)strlen(hostname) + 1;
      code = Curl_write_plain(conn, sock, (char *)hostname, hostnamelen,
                              &written);
      if(code || (written != hostnamelen)) {
        failf(data, "Failed to send SOCKS4 connect request.");
        return CURLE_COULDNT_CONNECT;
      }
    }

    packetsize = 8; /* receive data size */

    /* Receive response */
    result = Curl_blockread_all(conn, sock, (char *)socksreq, packetsize,
                                &actualread);
    if(result || (actualread != packetsize)) {
      failf(data, "Failed to receive SOCKS4 connect request ack.");
      return CURLE_COULDNT_CONNECT;
    }

    /*
     * Response format
     *
     *     +----+----+----+----+----+----+----+----+
     *     | VN | CD | DSTPORT |      DSTIP        |
     *     +----+----+----+----+----+----+----+----+
     * # of bytes:  1    1      2              4
     *
     * VN is the version of the reply code and should be 0. CD is the result
     * code with one of the following values:
     *
     * 90: request granted
     * 91: request rejected or failed
     * 92: request rejected because SOCKS server cannot connect to
     *     identd on the client
     * 93: request rejected because the client program and identd
     *     report different user-ids
     */

    /* wrong version ? */
    if(socksreq[0] != 0) {
      failf(data,
            "SOCKS4 reply has wrong version, version should be 4.");
      return CURLE_COULDNT_CONNECT;
    }

    /* Result */
    switch(socksreq[1]) {
    case 90:
      infof(data, "SOCKS4%s request granted.\n", protocol4a?"a":"");
      break;
    case 91:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected or failed.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            ((socksreq[8] << 8) | socksreq[9]),
            socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 92:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because SOCKS server cannot connect to "
            "identd on the client.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            ((socksreq[8] << 8) | socksreq[9]),
            socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    case 93:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", request rejected because the client program and identd "
            "report different user-ids.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            ((socksreq[8] << 8) | socksreq[9]),
            socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    default:
      failf(data,
            "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
            ", Unknown.",
            (unsigned char)socksreq[4], (unsigned char)socksreq[5],
            (unsigned char)socksreq[6], (unsigned char)socksreq[7],
            ((socksreq[8] << 8) | socksreq[9]),
            socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    }
  }

  (void)curlx_nonblock(sock, TRUE);

  return CURLE_OK; /* Proxy was successful! */
}